

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifink(bifcxdef *ctx,int argc)

{
  int iVar1;
  size_t sVar2;
  size_t len;
  char str [20];
  int extc;
  int c;
  undefined8 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  runcxdef *in_stack_ffffffffffffffe0;
  
  outflushn(0);
  iVar1 = os_getc_raw();
  if (iVar1 == 0) {
    os_getc_raw();
  }
  get_ext_key_name(in_stack_ffffffffffffffd8,(int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                   (int)in_stack_ffffffffffffffd0);
  sVar2 = strlen(&stack0xffffffffffffffd8);
  outreset();
  runpstr(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int)(sVar2 >> 0x20),(int)sVar2);
  return;
}

Assistant:

void bifink(bifcxdef *ctx, int argc)
{
    int    c;
    int    extc;
    char   str[20];
    size_t len;
    
    bifcntargs(ctx, 0, argc);
    tioflushn(ctx->bifcxtio, 0);

    /* get a key */
    c = os_getc_raw();

    /* if it's extended, get the second part of the extended sequence */
    extc = (c == 0 ? os_getc_raw() : 0);

    /* map the extended key name */
    get_ext_key_name(str, c, extc);

    /* get the length of the name */
    len = strlen(str);

    /* reset the [more] counter */
    outreset();

    /* return the string, translating escapes */
    runpstr(ctx->bifcxrun, str, len, 0);
}